

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataCommon.cpp
# Opt level: O1

void DATA_CONVERSION::ConvertSamplesToUniformSpikeTrains
               (vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                *samples,
               vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
               *spikeTrains,float inputSimulationTime,float minRate,float maxRate)

{
  float *pfVar1;
  vector<float,_std::allocator<float>_> *this;
  pointer pfVar2;
  pointer pfVar3;
  pointer pvVar4;
  pointer pfVar5;
  iterator __position;
  void *pvVar6;
  ulong uVar7;
  pointer pvVar8;
  int iVar9;
  size_type sVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  float fVar15;
  float fVar16;
  vector<float,_std::allocator<float>_> maxValues;
  vector<float,_std::allocator<float>_> minValues;
  value_type_conflict1 local_90;
  allocator_type local_89;
  size_type local_88;
  float local_80;
  float local_7c;
  size_type local_78;
  float local_70;
  float local_6c;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *local_68;
  vector<float,_std::allocator<float>_> local_60;
  vector<float,_std::allocator<float>_> local_48;
  
  pvVar8 = (samples->
           super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pvVar8 != (samples->
                super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start._0_4_ = 0;
    local_80 = minRate;
    local_7c = inputSimulationTime;
    std::vector<float,_std::allocator<float>_>::vector
              (&local_48,
               (long)(pvVar8->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(pvVar8->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 2,(value_type_conflict1 *)&local_60,
               (allocator_type *)&local_90);
    pvVar8 = (samples->
             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_90 = 0.0;
    std::vector<float,_std::allocator<float>_>::vector
              (&local_60,
               (long)*(pointer *)
                      ((long)&(pvVar8->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                              super__Vector_impl_data + 8) -
               *(long *)&(pvVar8->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                         super__Vector_impl_data >> 2,&local_90,&local_89);
    pvVar8 = (samples->
             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pfVar2 = (pvVar8->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pfVar3 = (pvVar8->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    local_88 = (long)pfVar3 - (long)pfVar2 >> 2;
    if (pfVar3 != pfVar2) {
      lVar11 = 0;
      do {
        local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar11] = pfVar2[lVar11];
        *(float *)(CONCAT44(local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start._0_4_) + lVar11 * 4) = pfVar2[lVar11];
        lVar11 = lVar11 + 1;
      } while (local_88 + (local_88 == 0) != lVar11);
    }
    pvVar4 = (samples->
             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    sVar10 = ((long)pvVar4 - (long)pvVar8 >> 3) * -0x5555555555555555;
    if (pvVar4 != pvVar8) {
      lVar11 = 0;
      do {
        if (pfVar3 != pfVar2) {
          pfVar5 = pvVar8[lVar11].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar12 = 0;
          do {
            fVar15 = pfVar5[lVar12];
            if (fVar15 < local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar12]) {
              local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start[lVar12] = fVar15;
            }
            fVar15 = pfVar5[lVar12];
            pfVar1 = (float *)(CONCAT44(local_60.super__Vector_base<float,_std::allocator<float>_>.
                                        _M_impl.super__Vector_impl_data._M_start._4_4_,
                                        local_60.super__Vector_base<float,_std::allocator<float>_>.
                                        _M_impl.super__Vector_impl_data._M_start._0_4_) + lVar12 * 4
                              );
            if (*pfVar1 <= fVar15 && fVar15 != *pfVar1) {
              *(float *)(CONCAT44(local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                  .super__Vector_impl_data._M_start._4_4_,
                                  local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                  .super__Vector_impl_data._M_start._0_4_) + lVar12 * 4) = fVar15;
            }
            lVar12 = lVar12 + 1;
          } while (local_88 + (local_88 == 0) != lVar12);
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != sVar10 + (sVar10 == 0));
    }
    std::
    vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
    ::resize(spikeTrains,sVar10);
    if ((samples->
        super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish !=
        (samples->
        super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start) {
      lVar11 = 0;
      uVar14 = 0;
      do {
        std::
        vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ::resize((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  *)(*(long *)spikeTrains + lVar11),local_88);
        uVar14 = uVar14 + 1;
        uVar7 = ((long)(samples->
                       super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(samples->
                       super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
        lVar11 = lVar11 + 0x18;
      } while (uVar14 <= uVar7 && uVar7 - uVar14 != 0);
    }
    if (pfVar3 != pfVar2) {
      fVar15 = maxRate - local_80;
      local_88 = local_88 + (local_88 == 0);
      local_78 = 0;
      local_68 = samples;
      do {
        sVar10 = local_78;
        pvVar8 = (local_68->
                 super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if ((local_68->
            super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish != pvVar8) {
          local_70 = *(float *)(CONCAT44(local_60.super__Vector_base<float,_std::allocator<float>_>.
                                         _M_impl.super__Vector_impl_data._M_start._4_4_,
                                         local_60.super__Vector_base<float,_std::allocator<float>_>.
                                         _M_impl.super__Vector_impl_data._M_start._0_4_) +
                               local_78 * 4) -
                     local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start[local_78];
          uVar14 = 0;
          do {
            fVar16 = (((pvVar8[uVar14].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start[local_78] -
                       local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start[local_78]) / local_70) * fVar15 + local_80)
                     * local_7c;
            iVar9 = (int)fVar16;
            if (0 < iVar9) {
              local_6c = local_7c / (float)(int)fVar16;
              iVar13 = 0;
              do {
                this = (vector<float,_std::allocator<float>_> *)
                       (*(long *)(*(long *)spikeTrains + uVar14 * 0x18) + sVar10 * 0x18);
                local_90 = (float)iVar13 * local_6c;
                __position._M_current =
                     (this->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
                if (__position._M_current ==
                    (this->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                            (this,__position,&local_90);
                }
                else {
                  *__position._M_current = local_90;
                  (this->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                  super__Vector_impl_data._M_finish = __position._M_current + 1;
                }
                iVar13 = iVar13 + 1;
              } while (iVar9 != iVar13);
            }
            uVar14 = uVar14 + 1;
            pvVar8 = (local_68->
                     super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            uVar7 = ((long)(local_68->
                           super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar8 >> 3) *
                    -0x5555555555555555;
          } while (uVar14 <= uVar7 && uVar7 - uVar14 != 0);
        }
        local_78 = local_78 + 1;
      } while (local_78 != local_88);
    }
    pvVar6 = (void *)CONCAT44(local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_,
                              local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start._0_4_);
    if (pvVar6 != (void *)0x0) {
      operator_delete(pvVar6,(long)local_60.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar6)
      ;
    }
    if (local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void DATA_CONVERSION::ConvertSamplesToUniformSpikeTrains(
        std::vector<SPIKING_NN::Sample> &samples,
        std::vector<SPIKING_NN::SpikeTrain> &spikeTrains,
        float inputSimulationTime,
        float minRate, float maxRate )
{
    if ( samples.empty()) {
        return;
    }

    std::vector<float> minValues( samples[0].size(), 0 );
    std::vector<float> maxValues( samples[0].size(), 0 );
    for ( auto activationId = 0; activationId < samples[0].size(); ++activationId ) {
        minValues[activationId] = samples[0][activationId];
        maxValues[activationId] = samples[0][activationId];
    }

    for ( auto sampleId = 0; sampleId < samples.size(); ++sampleId ) {
        for ( auto activationId = 0; activationId < samples[0].size(); ++activationId ) {
            if ( samples[sampleId][activationId] < minValues[activationId] ) {
                minValues[activationId] = samples[sampleId][activationId];
            }
            if ( samples[sampleId][activationId] > maxValues[activationId] ) {
                maxValues[activationId] = samples[sampleId][activationId];
            }
        }
    }

    // We are not checking maxValues[idx] == minValues[idx] because such params are redundant in dataset
    std::uniform_real_distribution<float> distribution( 0, 1 );
    std::uniform_real_distribution<float> timeNoiseDistribution( 0, SPIKING_NN::TIME_STEP / 1e4f );
    size_t inputSize = samples[0].size();
    spikeTrains.resize( samples.size());
    for ( int idx = 0; idx < samples.size(); ++idx ) {
        spikeTrains[idx].resize( inputSize );
    }
    for ( auto activationId = 0; activationId < inputSize; ++activationId ) {
        float maxDelta = ( maxValues[activationId] - minValues[activationId] );
        for ( int sid = 0; sid < samples.size(); ++sid ) {
            float &activation = samples[sid][activationId];
            float intensity = ( activation - minValues[activationId] ) / maxDelta;
            int numSpikes = static_cast<int>(inputSimulationTime * ( intensity * ( maxRate - minRate ) + minRate ));
            float spikeStep = inputSimulationTime / numSpikes;
            for ( int tdx = 0; tdx < numSpikes; ++tdx ) {
                spikeTrains[sid][activationId].emplace_back( tdx * spikeStep );
            }
        }
    }
}